

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O3

Address * cfd::ElementsAddressFactory::CreatePegInAddress
                    (Address *__return_storage_ptr__,NetType mainchain_net_type,
                    AddressType address_type,Script *tweak_fedpegscript)

{
  CfdException *this;
  Script witness_program;
  Script local_58;
  
  if (address_type == kP2shP2wshAddress) {
    core::ScriptUtil::CreateP2wshLockingScript(&local_58,tweak_fedpegscript);
    core::Address::Address(__return_storage_ptr__,mainchain_net_type,&local_58);
    core::Script::~Script(&local_58);
  }
  else if (address_type == kP2wshAddress) {
    core::Address::Address(__return_storage_ptr__,mainchain_net_type,kVersion0,tweak_fedpegscript);
  }
  else {
    if (address_type != kP2shAddress) {
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._vptr_Script =
           (_func_int **)
           ((long)&local_58.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Pubkey-hash cannot be used for the peg-in address type.","");
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_58);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Address::Address(__return_storage_ptr__,mainchain_net_type,tweak_fedpegscript);
  }
  return __return_storage_ptr__;
}

Assistant:

Address ElementsAddressFactory::CreatePegInAddress(
    NetType mainchain_net_type, AddressType address_type,
    const Script& tweak_fedpegscript) {
  if (address_type == AddressType::kP2shAddress) {
    return Address(mainchain_net_type, tweak_fedpegscript);
  } else if (address_type == AddressType::kP2wshAddress) {
    return Address(
        mainchain_net_type, WitnessVersion::kVersion0, tweak_fedpegscript);
  } else if (address_type == AddressType::kP2shP2wshAddress) {
    Script witness_program =
        ScriptUtil::CreateP2wshLockingScript(tweak_fedpegscript);
    return Address(mainchain_net_type, witness_program);
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Pubkey-hash cannot be used for the peg-in address type.");
  }
}